

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O3

void wallet::wallet_crypto_tests::TestCrypter::TestEncryptSingle
               (CCrypter *crypt,CKeyingMaterial *plaintext,
               span<const_unsigned_char,_18446744073709551615UL> correct_ciphertext)

{
  long lVar1;
  pointer puVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext_00;
  const_string msg;
  span<const_unsigned_char,_18446744073709551615UL> correct_plaintext;
  char *local_c8;
  char *local_c0;
  lazy_ostream local_b8;
  undefined1 *local_a8;
  char *local_a0;
  equal_coll_impl local_91;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CCrypter::Encrypt(crypt,plaintext,&ciphertext);
  if (correct_ciphertext._M_extent._M_extent_value._M_extent_value != 0) {
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_60 = "";
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x42;
    file.m_begin = (iterator)&local_68;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (&local_90,&local_91,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                )correct_ciphertext._M_ptr,
               (__normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
                )(correct_ciphertext._M_ptr +
                 correct_ciphertext._M_extent._M_extent_value._M_extent_value));
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_a8 = boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    local_c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_c0 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_90,&local_b8,1,0xd,4,0xf8d041,(size_t)&local_c8,0x42,"ciphertext.end()",
               "correct_ciphertext.begin()","correct_ciphertext.end()");
    boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  }
  ciphertext_00._M_extent._M_extent_value =
       (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  puVar2 = (plaintext->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  correct_plaintext._M_extent._M_extent_value =
       (long)(plaintext->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  ciphertext_00._M_ptr =
       ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  correct_plaintext._M_ptr = puVar2;
  TestDecrypt(crypt,ciphertext_00,correct_plaintext);
  if (ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)ciphertext.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)ciphertext.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestEncryptSingle(const CCrypter& crypt, const CKeyingMaterial& plaintext,
                              const std::span<const unsigned char> correct_ciphertext = {})
{
    std::vector<unsigned char> ciphertext;
    crypt.Encrypt(plaintext, ciphertext);

    if (!correct_ciphertext.empty()) {
        BOOST_CHECK_EQUAL_COLLECTIONS(ciphertext.begin(), ciphertext.end(), correct_ciphertext.begin(), correct_ciphertext.end());
    }

    TestDecrypt(crypt, ciphertext, /*correct_plaintext=*/plaintext);
}